

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O2

uint prvTidygetNextErrorCode(TidyIterator *iter)

{
  uint uVar1;
  TidyIterator p_Var2;
  uint uVar3;
  long lVar4;
  TidyIterator p_Var5;
  
  if (iter != (TidyIterator *)0x0) {
    p_Var5 = *iter;
    uVar3 = 0;
    if (p_Var5 == (TidyIterator)0x0) {
      lVar4 = 0;
      p_Var5 = (TidyIterator)0x0;
    }
    else {
      uVar1 = tidyErrorCodeListSize();
      if ((TidyIterator)(ulong)uVar1 < p_Var5) {
        lVar4 = 0;
      }
      else {
        lVar4 = (long)p_Var5 * 0x10 + 0x1daf40;
        p_Var5 = (TidyIterator)((long)&p_Var5->_opaque + 1);
      }
    }
    uVar1 = tidyErrorCodeListSize();
    p_Var2 = (TidyIterator)0x0;
    if (p_Var5 <= (TidyIterator)(ulong)uVar1) {
      p_Var2 = p_Var5;
    }
    *iter = p_Var2;
    if (lVar4 != 0) {
      uVar3 = *(uint *)(lVar4 + 8);
    }
    return uVar3;
  }
  __assert_fail("iter != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/htacg[P]tidy-html5/src/message.c"
                ,0x5d8,"uint prvTidygetNextErrorCode(TidyIterator *)");
}

Assistant:

uint TY_(getNextErrorCode)( TidyIterator* iter )
{
    const tidyStringsKeyItem *item = NULL;
    size_t itemIndex;
    assert( iter != NULL );
    
    itemIndex = (size_t)*iter;
    
    if ( itemIndex > 0 && itemIndex <= tidyErrorCodeListSize() )
    {
        item = &tidyStringsKeys[itemIndex - 1];
        itemIndex++;
    }
    
    *iter = (TidyIterator)( itemIndex <= tidyErrorCodeListSize() ? itemIndex : (size_t)0 );
    return item ? item->value : 0;
}